

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeCost
          (CostAttributes *this,IndexRange *selectedRange,uint totalDimension)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  IndexSelector *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_2d;
  uint local_2c;
  IndexSelector *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_28 = (IndexSelector *)0x0;
  local_2c = totalDimension;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::IndexSelector,std::allocator<iDynTree::optimalcontrol::IndexSelector>,iDynTree::IndexRange_const&,unsigned_int&>
            (&_Stack_20,&local_28,(allocator<iDynTree::optimalcontrol::IndexSelector> *)&local_2d,
             selectedRange,&local_2c);
  _Var2._M_pi = _Stack_20._M_pi;
  pIVar1 = local_28;
  local_28 = (IndexSelector *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->selector).
            super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->selector).
  super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pIVar1->super_Selector;
  (this->selector).
  super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  initializeBuffers(this,(uint)selectedRange->size,local_2c);
  return;
}

Assistant:

void initializeCost(const IndexRange& selectedRange, unsigned int totalDimension) {
                this->selector = std::make_shared<IndexSelector>(selectedRange, totalDimension);
                unsigned int rangeSize = static_cast<unsigned int>(selectedRange.size);
                initializeBuffers(rangeSize, totalDimension);
            }